

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O0

int __thiscall asmjit::v1_14::RALocalAllocator::init(RALocalAllocator *this,EVP_PKEY_CTX *ctx)

{
  Error EVar1;
  BaseRAPass *pBVar2;
  WorkToPhysMap *pWVar3;
  PhysToWorkMap *workRegs;
  WorkToPhysMap *pWVar4;
  RAAssignment *unaff_retaddr;
  WorkToPhysMap *workToPhysMap;
  PhysToWorkMap *physToWorkMap;
  BaseRAPass *in_stack_ffffffffffffffd8;
  RALocalAllocator *physCount;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  WorkToPhysMap *in_stack_fffffffffffffff0;
  BaseRAPass *physToWorkMap_00;
  
  physCount = this;
  pBVar2 = (BaseRAPass *)BaseRAPass::newPhysToWorkMap(in_stack_ffffffffffffffd8);
  pWVar3 = BaseRAPass::newWorkToPhysMap
                     ((BaseRAPass *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if ((pBVar2 == (BaseRAPass *)0x0) || (pWVar3 == (WorkToPhysMap *)0x0)) {
    EVar1 = DebugUtils::errored(1);
  }
  else {
    physToWorkMap_00 = this->_pass;
    RAAssignment::initLayout
              ((RAAssignment *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               (RARegCount *)physCount,(RAWorkRegs *)pBVar2);
    RAAssignment::initMaps
              (unaff_retaddr,(PhysToWorkMap *)physToWorkMap_00,in_stack_fffffffffffffff0);
    workRegs = BaseRAPass::newPhysToWorkMap(pBVar2);
    pWVar3 = BaseRAPass::newWorkToPhysMap
                       ((BaseRAPass *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
    ;
    pWVar4 = BaseRAPass::newWorkToPhysMap
                       ((BaseRAPass *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
    ;
    this->_tmpWorkToPhysMap = pWVar4;
    if ((workRegs == (PhysToWorkMap *)0x0) ||
       ((pWVar3 == (WorkToPhysMap *)0x0 || (this->_tmpWorkToPhysMap == (WorkToPhysMap *)0x0)))) {
      EVar1 = DebugUtils::errored(1);
    }
    else {
      pBVar2 = this->_pass;
      RAAssignment::initLayout
                ((RAAssignment *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (RARegCount *)physCount,(RAWorkRegs *)workRegs);
      RAAssignment::initMaps
                (unaff_retaddr,(PhysToWorkMap *)physToWorkMap_00,(WorkToPhysMap *)pBVar2);
      EVar1 = 0;
    }
  }
  return EVar1;
}

Assistant:

Error RALocalAllocator::init() noexcept {
  PhysToWorkMap* physToWorkMap;
  WorkToPhysMap* workToPhysMap;

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  if (!physToWorkMap || !workToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _curAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _curAssignment.initMaps(physToWorkMap, workToPhysMap);

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  _tmpWorkToPhysMap = _pass->newWorkToPhysMap();

  if (!physToWorkMap || !workToPhysMap || !_tmpWorkToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _tmpAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _tmpAssignment.initMaps(physToWorkMap, workToPhysMap);

  return kErrorOk;
}